

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  SessionHandle *data;
  SASLproto *pSVar1;
  CURLcode CVar2;
  uint uVar3;
  size_t uznum;
  HMAC_context *ctxt;
  char *pcVar4;
  size_t uznum_00;
  uchar *key;
  saslstate sVar5;
  char *resp;
  size_t len;
  uchar *local_b0;
  char *chlg;
  char *local_a0;
  size_t chlglen;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  char *serverdata;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  
  data = conn->data;
  resp = (char *)0x0;
  chlg = (char *)0x0;
  chlglen = 0;
  len = 0;
  *progress = SASL_INPROGRESS;
  sVar5 = sasl->state;
  if (sVar5 == SASL_CANCEL) {
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar2 = Curl_sasl_start(sasl,conn,sasl->force_ir,progress);
    sVar5 = sasl->state;
    goto LAB_0045e01a;
  }
  if (sVar5 == SASL_FINAL) {
    CVar2 = CURLE_LOGIN_DENIED;
    if (sasl->params->finalcode == code) {
      CVar2 = CURLE_OK;
    }
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CVar2;
  }
  pSVar1 = sasl->params;
  if (pSVar1->contcode != code) {
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CURLE_LOGIN_DENIED;
  }
  switch(sVar5) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    CVar2 = sasl_create_plain_message(data,conn->user,conn->passwd,&resp,&len);
    break;
  case SASL_LOGIN:
    CVar2 = sasl_create_login_message(data,conn->user,&resp,&len);
    sVar5 = SASL_LOGIN_PASSWD;
    goto LAB_0045e01a;
  case SASL_LOGIN_PASSWD:
    pcVar4 = conn->passwd;
    goto LAB_0045dfa1;
  case SASL_EXTERNAL:
    pcVar4 = conn->user;
LAB_0045dfa1:
    CVar2 = sasl_create_login_message(data,pcVar4,&resp,&len);
    break;
  case SASL_CRAMMD5:
    (*pSVar1->getmessage)((data->state).buffer,&serverdata);
    chlg = (char *)0x0;
    chlglen = 0;
    if ((*serverdata == '=') || (*serverdata == '\0')) {
      local_a0 = conn->user;
      key = (uchar *)conn->passwd;
LAB_0045dd88:
      local_b0 = (uchar *)0x0;
      uznum_00 = 0;
LAB_0045dd94:
      uznum = strlen((char *)key);
      uVar3 = curlx_uztoui(uznum);
      ctxt = Curl_HMAC_init(Curl_HMAC_MD5,key,uVar3);
      CVar2 = CURLE_OUT_OF_MEMORY;
      if (ctxt != (HMAC_context *)0x0) {
        if (uznum_00 != 0) {
          uVar3 = curlx_uztoui(uznum_00);
          Curl_HMAC_update(ctxt,local_b0,uVar3);
        }
        Curl_HMAC_final(ctxt,&local_48);
        local_b0 = (uchar *)(ulong)local_44;
        local_58 = (ulong)local_43;
        local_60 = (ulong)local_42;
        local_68 = (ulong)local_41;
        local_70 = (ulong)local_40;
        local_78 = (ulong)local_3f;
        local_80 = (ulong)local_3e;
        local_88 = (ulong)local_3d;
        local_90 = (ulong)local_3c;
        pcVar4 = curl_maprintf("%s %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x"
                               ,local_a0,(ulong)local_48,(ulong)local_47,(ulong)local_46,
                               (ulong)local_45,local_b0,local_58,local_60,local_68,local_70,local_78
                               ,local_80,local_88,local_90,(ulong)local_3b,(ulong)local_3a,
                               (ulong)local_39);
        if (pcVar4 != (char *)0x0) {
          CVar2 = Curl_base64_encode(data,pcVar4,0,&resp,&len);
          (*Curl_cfree)(pcVar4);
        }
      }
    }
    else {
      CVar2 = Curl_base64_decode(serverdata,(uchar **)&chlg,&chlglen);
      if (CVar2 == CURLE_OK) {
        local_a0 = conn->user;
        key = (uchar *)conn->passwd;
        if (chlg == (char *)0x0) goto LAB_0045dd88;
        local_b0 = (uchar *)chlg;
        uznum_00 = strlen(chlg);
        goto LAB_0045dd94;
      }
    }
    (*Curl_cfree)(chlg);
    break;
  case SASL_DIGESTMD5:
    (*pSVar1->getmessage)((data->state).buffer,&serverdata);
    CVar2 = Curl_sasl_create_digest_md5_message
                      (data,serverdata,conn->user,conn->passwd,sasl->params->service,&resp,&len);
    sVar5 = SASL_DIGESTMD5_RESP;
    goto LAB_0045e01a;
  case SASL_DIGESTMD5_RESP:
    resp = (*Curl_cstrdup)("");
    if (resp == (char *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
      goto LAB_0045e03b;
    }
    sVar5 = SASL_FINAL;
    goto LAB_0045e051;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_0045e03b;
  case SASL_XOAUTH2:
    CVar2 = sasl_create_xoauth2_message(data,conn->user,conn->xoauth2_bearer,&resp,&len);
  }
  sVar5 = SASL_FINAL;
LAB_0045e01a:
  if (CVar2 == CURLE_OK) {
    if (resp == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
LAB_0045e051:
      CVar2 = (*sasl->params->sendcont)(conn,resp);
    }
  }
  else if (CVar2 == CURLE_BAD_CONTENT_ENCODING) {
    CVar2 = (*sasl->params->sendcont)(conn,"*");
    sVar5 = SASL_CANCEL;
  }
  else {
LAB_0045e03b:
    *progress = SASL_DONE;
    sVar5 = SASL_STOP;
  }
  (*Curl_cfree)(resp);
  sasl->state = sVar5;
  return CVar2;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *serverdata;
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = sasl_create_plain_message(data, conn->user, conn->passwd, &resp,
                                       &len);
    break;
  case SASL_LOGIN:
    result = sasl_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = sasl_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = sasl_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = sasl_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = sasl_create_cram_md5_message(data, chlg, conn->user,
                                            conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 sasl->params->service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    if(!(resp = strdup("")))
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_sasl_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  sasl->params->service,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_sasl_create_gssapi_user_message(data, NULL, NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_XOAUTH2:
    /* Create the authorisation message */
    result = sasl_create_xoauth2_message(data, conn->user,
                                         conn->xoauth2_bearer, &resp, &len);
    break;
  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}